

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prepared-c.cpp
# Opt level: O0

duckdb_state
duckdb_bind_decimal(duckdb_prepared_statement prepared_statement,idx_t param_idx,duckdb_decimal val)

{
  duckdb_hugeint val_00;
  byte in_stack_00000008;
  uint64_t in_stack_00000010;
  int64_t in_stack_00000018;
  Value duck_val;
  uint64_t value;
  Value value_1;
  hugeint_t hugeint_val;
  undefined4 in_stack_ffffffffffffff00;
  undefined4 in_stack_ffffffffffffff04;
  uint8_t in_stack_ffffffffffffff3e;
  uint8_t in_stack_ffffffffffffff3f;
  hugeint_t in_stack_ffffffffffffff40;
  uint8_t in_stack_ffffffffffffff76;
  uint8_t in_stack_ffffffffffffff77;
  int64_t in_stack_ffffffffffffff78;
  undefined4 local_4;
  
  val_00.upper = in_stack_00000018;
  val_00.lower = in_stack_00000010;
  duckdb_internal_hugeint(val_00);
  if (in_stack_00000008 < 0x13) {
    duckdb::Value::DECIMAL
              (in_stack_ffffffffffffff78,in_stack_ffffffffffffff77,in_stack_ffffffffffffff76);
    local_4 = duckdb_bind_value((duckdb_prepared_statement)
                                value_1.value_info_.internal.
                                super___shared_ptr<duckdb::ExtraValueInfo,_(__gnu_cxx::_Lock_policy)2>
                                ._M_refcount._M_pi,
                                (idx_t)value_1.value_info_.internal.
                                       super___shared_ptr<duckdb::ExtraValueInfo,_(__gnu_cxx::_Lock_policy)2>
                                       ._M_ptr,(duckdb_value)value_1.value_.hugeint.upper);
    duckdb::Value::~Value((Value *)CONCAT44(local_4,in_stack_ffffffffffffff00));
  }
  else {
    duckdb::Value::DECIMAL
              (in_stack_ffffffffffffff40,in_stack_ffffffffffffff3f,in_stack_ffffffffffffff3e);
    local_4 = duckdb_bind_value((duckdb_prepared_statement)
                                value_1.value_info_.internal.
                                super___shared_ptr<duckdb::ExtraValueInfo,_(__gnu_cxx::_Lock_policy)2>
                                ._M_refcount._M_pi,
                                (idx_t)value_1.value_info_.internal.
                                       super___shared_ptr<duckdb::ExtraValueInfo,_(__gnu_cxx::_Lock_policy)2>
                                       ._M_ptr,(duckdb_value)value_1.value_.hugeint.upper);
    duckdb::Value::~Value((Value *)CONCAT44(in_stack_ffffffffffffff04,in_stack_ffffffffffffff00));
  }
  return local_4;
}

Assistant:

duckdb_state duckdb_bind_decimal(duckdb_prepared_statement prepared_statement, idx_t param_idx, duckdb_decimal val) {
	auto hugeint_val = duckdb_internal_hugeint(val.value);
	if (val.width > duckdb::Decimal::MAX_WIDTH_INT64) {
		auto value = Value::DECIMAL(hugeint_val, val.width, val.scale);
		return duckdb_bind_value(prepared_statement, param_idx, (duckdb_value)&value);
	}
	auto value = hugeint_val.lower;
	auto duck_val = Value::DECIMAL((int64_t)value, val.width, val.scale);
	return duckdb_bind_value(prepared_statement, param_idx, (duckdb_value)&duck_val);
}